

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg.c
# Opt level: O2

int available_fds(uint n)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int fds [256];
  
  if (n < 0x101) {
    iVar2 = 0;
    uVar3 = 0;
    do {
      if (n == uVar3) goto LAB_00105869;
      iVar1 = socket(2,2,0);
      fds[uVar3] = iVar1;
      uVar3 = uVar3 + 1;
    } while (-1 < iVar1);
    iVar2 = 1;
LAB_00105869:
    for (uVar3 = 0; (n != uVar3 && (-1 < fds[uVar3])); uVar3 = uVar3 + 1) {
      close(fds[uVar3]);
    }
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
available_fds(unsigned int n)
{
	unsigned int	i;
	int		ret, fds[256];

	if (n > (sizeof(fds)/sizeof(fds[0])))
		return (1);

	ret = 0;
	for (i = 0; i < n; i++) {
		fds[i] = -1;
		if ((fds[i] = socket(AF_INET, SOCK_DGRAM, 0)) < 0) {
			ret = 1;
			break;
		}
	}

	for (i = 0; i < n && fds[i] >= 0; i++)
		close(fds[i]);

	return (ret);
}